

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMS_SENSITIVE_CREATE_Unmarshal(TPMS_SENSITIVE_CREATE *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = TPM2B_DIGEST_Unmarshal(&target->userAuth,buffer,size);
  if (TVar1 != 0) {
    return TVar1;
  }
  TVar1 = TPM2B_SENSITIVE_DATA_Unmarshal(&target->data,buffer,size);
  return TVar1;
}

Assistant:

TPM_RC
TPMS_SENSITIVE_CREATE_Unmarshal(TPMS_SENSITIVE_CREATE *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM2B_AUTH_Unmarshal((TPM2B_AUTH *)&(target->userAuth), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_SENSITIVE_DATA_Unmarshal((TPM2B_SENSITIVE_DATA *)&(target->data), buffer, size);
    return result;
}